

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::processQueryResponse(CoreBroker *this,ActionMessage *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  pointer ptVar3;
  byte *pbVar4;
  ActionMessage *pAVar5;
  ActionMessage *pAVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  CoreBroker *this_00;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pDVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  JsonMapBuilder *this_01;
  long lVar15;
  ActionMessage *this_02;
  string str;
  string local_90;
  CoreBroker *local_70;
  JsonMapBuilder *local_68;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  ActionMessage *local_58;
  string local_50;
  
  uVar2 = message->counter;
  if (uVar2 == 0) {
    iVar11 = message->messageID;
    pbVar4 = (message->payload).heap;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pbVar4,pbVar4 + (message->payload).bufferSize);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar11,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
  }
  else {
    ptVar3 = (this->mapBuilders).
             super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((uint)(*(int *)&(this->mapBuilders).
                          super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (int)ptVar3) >> 5) *
         -0x55555555 & 0xffff) <= (uint)uVar2) {
      return;
    }
    local_60 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(ulong)((uint)uVar2 * 0x60);
    this_01 = (JsonMapBuilder *)
              ((long)&(ptVar3->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).
                      super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      .super__Tuple_impl<2UL,_helics::QueryReuse> +
              (long)&(local_60->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_right);
    pbVar4 = (message->payload).heap;
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pbVar4,pbVar4 + (message->payload).bufferSize);
    local_68 = this_01;
    local_58 = message;
    bVar10 = fileops::JsonMapBuilder::addComponent(this_01,&local_90,message->messageID);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar10) {
      return;
    }
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    if (local_58->counter == 8) {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,0,0,
                 "{\"status\":true}",0xf);
    }
    else if (local_58->counter == 9) {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      generateGlobalStatus_abi_cxx11_(&local_50,this,local_68);
      processQueryResponse();
    }
    else {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      fileops::JsonMapBuilder::generate_abi_cxx11_((string *)&local_50,local_68);
      processQueryResponse();
    }
    pDVar9 = local_60;
    lVar12 = *(long *)((long)&(local_60->promiseByInteger)._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_color +
                      (long)&(ptVar3->
                             super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             ).
                             super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      );
    lVar13 = *(long *)((long)&(local_60->promiseByInteger)._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_color +
                      (long)&(ptVar3->
                             super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             ).
                             super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             .
                             super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                             ._M_head_impl.
                             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                      );
    local_70 = this;
    if (1 < (int)((ulong)(lVar13 - lVar12) >> 3) * -0x1642c859) {
      local_60 = &this->activeQueries;
      lVar14 = 0;
      lVar15 = 0;
      do {
        sVar8 = local_90._M_string_length;
        _Var7._M_p = local_90._M_dataplus._M_p;
        if (*(int *)(lVar12 + 0x10 + lVar14) ==
            (local_70->super_BrokerBase).global_broker_id_local.gid) {
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(local_60,*(int *)(lVar12 + 4 + lVar14),&local_90);
        }
        else {
          if (local_90._M_dataplus._M_p == *(pointer *)(lVar12 + 0x90 + lVar14)) {
            *(size_type *)(lVar12 + 0x80 + lVar14) = local_90._M_string_length;
          }
          else {
            SmallBuffer::reserve((SmallBuffer *)(lVar12 + lVar14 + 0x40),local_90._M_string_length);
            *(size_type *)(lVar12 + 0x80 + lVar14) = sVar8;
            if (sVar8 != 0) {
              memcpy(*(void **)(lVar12 + 0x90 + lVar14),_Var7._M_p,sVar8);
            }
          }
          routeMessage(local_70,(ActionMessage *)
                                (*(long *)((long)&(pDVar9->promiseByInteger)._M_t._M_impl.
                                                  super__Rb_tree_header._M_header._M_color +
                                          (long)&(ptVar3->
                                                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                                 ).
                                                 super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                          ) + lVar14));
        }
        lVar15 = lVar15 + 1;
        lVar12 = *(long *)((long)&(pDVar9->promiseByInteger)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_color +
                          (long)&(ptVar3->
                                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                 ).
                                 super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          );
        lVar13 = *(long *)((long)&(pDVar9->promiseByInteger)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_color +
                          (long)&(ptVar3->
                                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                 ).
                                 super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                 .
                                 super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                 ._M_head_impl.
                                 super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                          );
        lVar14 = lVar14 + 0xb8;
      } while (lVar15 < (int)((ulong)(lVar13 - lVar12) >> 3) * -0x1642c859 + -1);
    }
    this_00 = local_70;
    sVar8 = local_90._M_string_length;
    _Var7._M_p = local_90._M_dataplus._M_p;
    if (*(int *)(lVar13 + -0xa8) == (local_70->super_BrokerBase).global_broker_id_local.gid) {
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue(&local_70->activeQueries,*(int *)(lVar13 + -0xb4),&local_90);
    }
    else {
      if (local_90._M_dataplus._M_p == *(pointer *)(lVar13 + -0x28)) {
        *(size_type *)(lVar13 + -0x38) = local_90._M_string_length;
      }
      else {
        SmallBuffer::reserve((SmallBuffer *)(lVar13 + -0x78),local_90._M_string_length);
        *(size_type *)(lVar13 + -0x38) = sVar8;
        if (sVar8 != 0) {
          memcpy(*(void **)(lVar13 + -0x28),_Var7._M_p,sVar8);
        }
      }
      routeMessage(this_00,(ActionMessage *)
                           (*(long *)((long)&(pDVar9->promiseByInteger)._M_t._M_impl.
                                             super__Rb_tree_header._M_header._M_color +
                                     (long)&(ptVar3->
                                            super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                            ).
                                            super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                            .
                                            super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                            ._M_head_impl.
                                            super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                     ) + -0xb8));
    }
    pAVar5 = *(ActionMessage **)
              ((long)&(pDVar9->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_color +
              (long)&(ptVar3->
                     super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                     ).
                     super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
              );
    pAVar6 = *(ActionMessage **)
              ((long)&(pDVar9->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_color +
              (long)&(ptVar3->
                     super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                     ).
                     super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                     .
                     super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
              );
    this_02 = pAVar5;
    if (pAVar6 != pAVar5) {
      do {
        ActionMessage::~ActionMessage(this_02);
        this_02 = this_02 + 1;
      } while (this_02 != pAVar6);
      *(ActionMessage **)
       ((long)&(pDVar9->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
       (long)&(ptVar3->
              super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
              ).
              super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
              .
              super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
              ._M_head_impl.
              super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>) =
           pAVar5;
    }
    if (*(char *)((long)&(((local_70->mapBuilders).
                           super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         ).
                         super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         .super__Tuple_impl<2UL,_helics::QueryReuse> +
                 (ulong)((uint)local_58->counter * 0x60)) == '\x01') {
      fileops::JsonMapBuilder::reset(local_68);
    }
    else {
      iVar11 = generateMapObjectCounter(local_70);
      *(int *)((long)&(ptVar3->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).
                      super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      .super__Tuple_impl<2UL,_helics::QueryReuse> +
              (long)&(pDVar9->promiseByString)._M_t._M_impl.super__Rb_tree_header._M_node_count) =
           iVar11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
  }
  operator_delete(local_90._M_dataplus._M_p,
                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                           local_90.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void CoreBroker::processQueryResponse(const ActionMessage& message)
{
    if (message.counter == GENERAL_QUERY) {
        activeQueries.setDelayedValue(message.messageID, std::string(message.payload.to_string()));
        return;
    }
    if (isValidIndex(message.counter, mapBuilders)) {
        auto& builder = std::get<0>(mapBuilders[message.counter]);
        auto& requesters = std::get<1>(mapBuilders[message.counter]);
        if (builder.addComponent(std::string(message.payload.to_string()), message.messageID)) {
            std::string str;
            switch (message.counter) {
                case GLOBAL_STATUS:
                    str = generateGlobalStatus(builder);
                    break;
                case GLOBAL_FLUSH:
                    str = "{\"status\":true}";
                    break;
                default:
                    str = builder.generate();
                    break;
            }

            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(mapBuilders[message.counter]) == QueryReuse::DISABLED) {
                builder.reset();
            } else {
                builder.setCounterCode(generateMapObjectCounter());
            }
        }
    }
}